

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O2

bool google::ParseCVQualifiers(State *state)

{
  char *pcVar1;
  char cVar2;
  char cVar3;
  char *pcVar4;
  char cVar5;
  
  pcVar4 = state->mangled_cur;
  cVar2 = *pcVar4;
  cVar3 = cVar2;
  if (cVar2 == 'r') {
    state->mangled_cur = pcVar4 + 1;
    pcVar1 = pcVar4 + 1;
    pcVar4 = pcVar4 + 1;
    cVar3 = *pcVar1;
  }
  cVar5 = cVar3;
  if (cVar3 == 'V') {
    state->mangled_cur = pcVar4 + 1;
    pcVar1 = pcVar4 + 1;
    pcVar4 = pcVar4 + 1;
    cVar5 = *pcVar1;
  }
  if (cVar5 == 'K') {
    state->mangled_cur = pcVar4 + 1;
  }
  return cVar5 == 'K' || (char)((cVar3 == 'V') + (cVar2 == 'r')) != '\0';
}

Assistant:

static bool ParseOneCharToken(State *state, const char one_char_token) {
  if (state->mangled_cur[0] == one_char_token) {
    ++state->mangled_cur;
    return true;
  }
  return false;
}